

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree_Nodes.hpp
# Opt level: O0

SListLeaf *
Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::SListLeaf::assimilate(Leaf *orig)

{
  SListLeaf *pSVar1;
  SListLeaf *pSVar2;
  Node *in_RDI;
  Leaf *unaff_retaddr;
  SListLeaf *res;
  TermList in_stack_ffffffffffffffd0;
  
  pSVar1 = (SListLeaf *)operator_new(0x3bf733);
  pSVar2 = (SListLeaf *)SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Node::term(in_RDI);
  SListLeaf(pSVar2,in_stack_ffffffffffffffd0);
  pSVar2 = pSVar1;
  (*in_RDI->_vptr_Node[8])();
  SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::Leaf::loadChildren
            (unaff_retaddr,(LDIterator *)in_RDI);
  Lib::VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*>::~VirtualIterator
            ((VirtualIterator<Inferences::ALASCA::Demodulation::Rhs_*> *)pSVar2);
  (*in_RDI->_vptr_Node[6])();
  if (in_RDI != (Node *)0x0) {
    (*in_RDI->_vptr_Node[1])();
  }
  return pSVar1;
}

Assistant:

typename SubstitutionTree<LeafData_>::SListLeaf* SubstitutionTree<LeafData_>::SListLeaf::assimilate(Leaf* orig)
{
  SListLeaf* res=new SListLeaf(orig->term());
  res->loadChildren(orig->allChildren());
  orig->makeEmpty();
  delete orig;
  return res;
}